

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

int32_t icu_63::binarySearch(char **array,int32_t start,int32_t end,char *key)

{
  int iVar1;
  int32_t unaff_EBP;
  int32_t iVar2;
  bool bVar3;
  
  do {
    if (end <= start) {
      return -1;
    }
    iVar2 = (start + end) / 2;
    iVar1 = strcmp(array[iVar2],key);
    bVar3 = iVar1 == 0;
    if (iVar1 < 0) {
      start = iVar2 + 1;
      bVar3 = false;
      iVar2 = unaff_EBP;
    }
    else if (!bVar3) {
      end = iVar2;
      iVar2 = unaff_EBP;
    }
    unaff_EBP = iVar2;
  } while (!bVar3);
  return iVar2;
}

Assistant:

static int32_t binarySearch(
        const char * const * array, int32_t start, int32_t end, const char * key) {
    while (start < end) {
        int32_t mid = (start + end) / 2;
        int32_t cmp = uprv_strcmp(array[mid], key);
        if (cmp < 0) {
            start = mid + 1;
            continue;
        }
        if (cmp == 0) {
            return mid;
        }
        end = mid;
    }
    return -1;
}